

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-spawn.c
# Opt level: O3

int run_test_spawn_tcp_server(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_timer_t *puVar3;
  int extraout_EDX;
  uv_process_t *puVar4;
  uv_timer_t *puVar5;
  code *pcVar6;
  char *pcVar7;
  int fd;
  sockaddr_in addr;
  uv_stdio_container_t stdio [4];
  int local_5c;
  undefined1 local_58 [16];
  uv_stdio_container_t local_48;
  undefined4 local_38;
  undefined4 local_30;
  undefined4 local_28;
  undefined4 local_20;
  undefined4 local_18;
  int local_10;
  
  init_process_options("spawn_tcp_server_helper",exit_cb);
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,local_58);
  if (iVar1 == 0) {
    local_5c = -1;
    uVar2 = uv_default_loop();
    iVar1 = uv_tcp_init_ex(uVar2,&tcp_server,2);
    if (iVar1 != 0) goto LAB_0017a4c7;
    iVar1 = uv_tcp_bind(&tcp_server,local_58,0);
    if (iVar1 != 0) goto LAB_0017a4cc;
    iVar1 = uv_fileno(&tcp_server,&local_5c);
    if (iVar1 != 0) goto LAB_0017a4d1;
    if (local_5c < 1) goto LAB_0017a4d6;
    options.stdio = &local_48;
    local_48.flags = UV_INHERIT_FD;
    local_48.data.fd = 0;
    local_38 = 2;
    local_30 = 1;
    local_28 = 2;
    local_20 = 2;
    local_18 = 2;
    local_10 = local_5c;
    options.stdio_count = 4;
    uVar2 = uv_default_loop();
    iVar1 = uv_spawn(uVar2,&process,&options);
    if (iVar1 != 0) goto LAB_0017a4db;
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0017a4e0;
    if (exit_cb_called != 1) goto LAB_0017a4e5;
    if (close_cb_called != 1) goto LAB_0017a4ea;
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_tcp_server_cold_1();
LAB_0017a4c7:
    run_test_spawn_tcp_server_cold_2();
LAB_0017a4cc:
    run_test_spawn_tcp_server_cold_3();
LAB_0017a4d1:
    run_test_spawn_tcp_server_cold_4();
LAB_0017a4d6:
    run_test_spawn_tcp_server_cold_5();
LAB_0017a4db:
    run_test_spawn_tcp_server_cold_6();
LAB_0017a4e0:
    run_test_spawn_tcp_server_cold_7();
LAB_0017a4e5:
    run_test_spawn_tcp_server_cold_8();
LAB_0017a4ea:
    run_test_spawn_tcp_server_cold_9();
  }
  run_test_spawn_tcp_server_cold_10();
  init_process_options("spawn_helper6",exit_cb);
  options.stdio = (uv_stdio_container_t *)0x0;
  options.stdio_count = 0;
  uVar2 = uv_default_loop();
  iVar1 = uv_spawn(uVar2,&process,&options);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_0017a5a6;
    if (exit_cb_called != 1) goto LAB_0017a5ab;
    if (close_cb_called != 1) goto LAB_0017a5b0;
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    uv_run(uVar2,0);
    uVar2 = uv_default_loop();
    iVar1 = uv_loop_close(uVar2);
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_ignored_stdio_cold_1();
LAB_0017a5a6:
    run_test_spawn_ignored_stdio_cold_2();
LAB_0017a5ab:
    run_test_spawn_ignored_stdio_cold_3();
LAB_0017a5b0:
    run_test_spawn_ignored_stdio_cold_4();
  }
  run_test_spawn_ignored_stdio_cold_5();
  init_process_options("spawn_helper4",kill_cb);
  puVar3 = (uv_timer_t *)uv_default_loop();
  puVar4 = &process;
  iVar1 = uv_spawn(puVar3,&process,&options);
  if (iVar1 == 0) {
    puVar3 = (uv_timer_t *)uv_default_loop();
    puVar5 = &timer;
    iVar1 = uv_timer_init();
    pcVar6 = (code *)puVar5;
    if (iVar1 != 0) goto LAB_0017a692;
    puVar3 = &timer;
    pcVar6 = timer_cb;
    iVar1 = uv_timer_start(&timer,timer_cb,500,0);
    if (iVar1 != 0) goto LAB_0017a697;
    puVar3 = (uv_timer_t *)uv_default_loop();
    pcVar6 = (code *)0x0;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_0017a69c;
    if (exit_cb_called != 1) goto LAB_0017a6a1;
    if (close_cb_called != 2) goto LAB_0017a6a6;
    uVar2 = uv_default_loop();
    uv_walk(uVar2,close_walk_cb,0);
    pcVar6 = (code *)0x0;
    uv_run(uVar2);
    puVar3 = (uv_timer_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    run_test_spawn_and_kill_cold_1();
    pcVar6 = (code *)puVar4;
LAB_0017a692:
    run_test_spawn_and_kill_cold_2();
LAB_0017a697:
    run_test_spawn_and_kill_cold_3();
LAB_0017a69c:
    run_test_spawn_and_kill_cold_4();
LAB_0017a6a1:
    run_test_spawn_and_kill_cold_5();
LAB_0017a6a6:
    run_test_spawn_and_kill_cold_6();
  }
  run_test_spawn_and_kill_cold_7();
  pcVar7 = "exit_cb";
  puts("exit_cb");
  exit_cb_called = exit_cb_called + 1;
  if ((uv_timer_t *)pcVar6 == (uv_timer_t *)0x0) {
    if (extraout_EDX == 0xf) {
      uv_close(puVar3,close_cb);
      pcVar7 = (char *)(ulong)*(uint *)puVar3->heap_node;
      iVar1 = uv_kill(pcVar7,0);
      if (iVar1 == -3) {
        return iVar1;
      }
      goto LAB_0017a705;
    }
  }
  else {
    kill_cb_cold_1();
  }
  kill_cb_cold_2();
LAB_0017a705:
  kill_cb_cold_3();
  uv_process_kill(&process,0xf);
  iVar1 = uv_close(pcVar7,close_cb);
  return iVar1;
}

Assistant:

TEST_IMPL(spawn_tcp_server) {
  uv_stdio_container_t stdio[4];
  struct sockaddr_in addr;
  int fd;
  int r;
#ifdef _WIN32
  uv_os_fd_t handle;
#endif

  init_process_options("spawn_tcp_server_helper", exit_cb);

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));

  fd = -1;
  r = uv_tcp_init_ex(uv_default_loop(), &tcp_server, AF_INET);
  ASSERT(r == 0);
  r = uv_tcp_bind(&tcp_server, (const struct sockaddr*) &addr, 0);
  ASSERT(r == 0);
#ifdef _WIN32
  r = uv_fileno((uv_handle_t*) &tcp_server, &handle);
  fd = _open_osfhandle((intptr_t) handle, 0);
#else
  r = uv_fileno((uv_handle_t*) &tcp_server, &fd);
 #endif
  ASSERT(r == 0);
  ASSERT(fd > 0);

  options.stdio = stdio;
  options.stdio[0].flags = UV_INHERIT_FD;
  options.stdio[0].data.fd = 0;
  options.stdio[1].flags = UV_INHERIT_FD;
  options.stdio[1].data.fd = 1;
  options.stdio[2].flags = UV_INHERIT_FD;
  options.stdio[2].data.fd = 2;
  options.stdio[3].flags = UV_INHERIT_FD;
  options.stdio[3].data.fd = fd;
  options.stdio_count = 4;

  r = uv_spawn(uv_default_loop(), &process, &options);
  ASSERT(r == 0);

  r = uv_run(uv_default_loop(), UV_RUN_DEFAULT);
  ASSERT(r == 0);

  ASSERT(exit_cb_called == 1);
  ASSERT(close_cb_called == 1);

  MAKE_VALGRIND_HAPPY();
  return 0;
}